

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O0

int ext_loader_impl_initialize_types(loader_impl impl)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 in_RDI;
  type t;
  type_id index;
  int local_14;
  
  local_14 = 0;
  do {
    if (0x12 < local_14) {
      return 0;
    }
    uVar2 = type_id_name(local_14);
    lVar3 = type_create(local_14,uVar2,0);
    if (lVar3 != 0) {
      uVar2 = type_name(lVar3);
      iVar1 = loader_impl_type_define(in_RDI,uVar2,lVar3);
      if (iVar1 != 0) {
        type_destroy(lVar3);
        return 1;
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

int ext_loader_impl_initialize_types(loader_impl impl)
{
	for (type_id index = 0; index < TYPE_SIZE; ++index)
	{
		type t = type_create(index, type_id_name(index), NULL, NULL);

		if (t != NULL)
		{
			if (loader_impl_type_define(impl, type_name(t), t) != 0)
			{
				type_destroy(t);
				return 1;
			}
		}
	}

	return 0;
}